

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O3

REF_STATUS ref_matrix_show_diag_sys(REF_DBL *d)

{
  printf("eig");
  printf("%24.15e",*d);
  printf("%24.15e",d[1]);
  printf("%24.15e",d[2]);
  putchar(10);
  printf("valx");
  printf("%24.15e",d[3]);
  printf("%24.15e",d[6]);
  printf("%24.15e",d[9]);
  putchar(10);
  printf("valy");
  printf("%24.15e",d[4]);
  printf("%24.15e",d[7]);
  printf("%24.15e",d[10]);
  putchar(10);
  printf("valz");
  printf("%24.15e",d[5]);
  printf("%24.15e",d[8]);
  printf("%24.15e",d[0xb]);
  putchar(10);
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_show_diag_sys(REF_DBL *d) {
  printf("eig");
  printf("%24.15e", ref_matrix_eig(d, 0));
  printf("%24.15e", ref_matrix_eig(d, 1));
  printf("%24.15e", ref_matrix_eig(d, 2));
  printf("\n");
  printf("valx");
  printf("%24.15e", ref_matrix_vec(d, 0, 0));
  printf("%24.15e", ref_matrix_vec(d, 0, 1));
  printf("%24.15e", ref_matrix_vec(d, 0, 2));
  printf("\n");
  printf("valy");
  printf("%24.15e", ref_matrix_vec(d, 1, 0));
  printf("%24.15e", ref_matrix_vec(d, 1, 1));
  printf("%24.15e", ref_matrix_vec(d, 1, 2));
  printf("\n");
  printf("valz");
  printf("%24.15e", ref_matrix_vec(d, 2, 0));
  printf("%24.15e", ref_matrix_vec(d, 2, 1));
  printf("%24.15e", ref_matrix_vec(d, 2, 2));
  printf("\n");
  return REF_SUCCESS;
}